

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SDLGraphicsSystem.cpp
# Opt level: O0

void __thiscall solitaire::graphics::SDLGraphicsSystem::renderFrame(SDLGraphicsSystem *this)

{
  int iVar1;
  runtime_error *prVar2;
  pointer pWVar3;
  SDLGraphicsSystem *this_local;
  
  if ((this->isWindowCreated & 1U) == 0) {
    prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar2,"Cannot render frame when window not created");
    __cxa_throw(prVar2,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  pWVar3 = std::
           unique_ptr<solitaire::SDL::interfaces::Wrapper,_std::default_delete<solitaire::SDL::interfaces::Wrapper>_>
           ::operator->(&this->sdl);
  (*pWVar3->_vptr_Wrapper[0xf])(pWVar3,&this->renderer);
  pWVar3 = std::
           unique_ptr<solitaire::SDL::interfaces::Wrapper,_std::default_delete<solitaire::SDL::interfaces::Wrapper>_>
           ::operator->(&this->sdl);
  iVar1 = (*pWVar3->_vptr_Wrapper[0xd])(pWVar3,&this->renderer);
  if (iVar1 != 0) {
    prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar2,"Cannot clear frame");
    __cxa_throw(prVar2,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  return;
}

Assistant:

void SDLGraphicsSystem::renderFrame() const {
    if (not isWindowCreated)
        throw std::runtime_error {"Cannot render frame when window not created"};

    sdl->renderPresent(renderer);

    if (sdl->renderClear(renderer))
        throw std::runtime_error {"Cannot clear frame"};
}